

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void autoIncrementEnd(Parse *pParse)

{
  Vdbe *p_00;
  int p2;
  int iLineno;
  VdbeOp *pVVar1;
  Parse *in_RDI;
  int memId;
  int iRec;
  Db *pDb;
  VdbeOp *aOp;
  sqlite3 *db;
  Vdbe *v;
  AutoincInfo *p;
  int p3;
  Table *pTab;
  Vdbe *p_01;
  sqlite3 *pParse_00;
  AutoincInfo *local_10;
  
  p_00 = in_RDI->pVdbe;
  pParse_00 = in_RDI->db;
  local_10 = in_RDI->pAinc;
  while( true ) {
    if (local_10 == (AutoincInfo *)0x0) {
      return;
    }
    p_01 = (Vdbe *)&DAT_aaaaaaaaaaaaaaaa;
    pTab = (Table *)(pParse_00->aDb + local_10->iDb);
    p3 = local_10->regCtr;
    p2 = sqlite3GetTempReg(in_RDI);
    iLineno = p3 + 2;
    sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeAddOp3(p_01,(int)((ulong)pTab >> 0x20),(int)pTab,p2,p3);
    sqlite3OpenTable((Parse *)pParse_00,(int)((ulong)p_01 >> 0x20),(int)p_01,pTab,p2);
    pVVar1 = sqlite3VdbeAddOpList
                       (p_01,(int)((ulong)pTab >> 0x20),(VdbeOpList *)CONCAT44(p2,p3),iLineno);
    if (pVVar1 == (VdbeOp *)0x0) break;
    pVVar1->p1 = p3 + 1;
    pVVar1[1].p2 = p3 + 1;
    pVVar1[2].p1 = p3 + -1;
    pVVar1[2].p3 = p2;
    pVVar1[3].p2 = p2;
    pVVar1[3].p3 = p3 + 1;
    pVVar1[3].p5 = 8;
    sqlite3ReleaseTempReg(in_RDI,p2);
    local_10 = local_10->pNext;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void autoIncrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    static const int iLn = VDBE_OFFSET_LINENO(2);
    static const VdbeOpList autoIncEnd[] = {
      /* 0 */ {OP_NotNull,     0, 2, 0},
      /* 1 */ {OP_NewRowid,    0, 0, 0},
      /* 2 */ {OP_MakeRecord,  0, 2, 0},
      /* 3 */ {OP_Insert,      0, 0, 0},
      /* 4 */ {OP_Close,       0, 0, 0}
    };
    VdbeOp *aOp;
    Db *pDb = &db->aDb[p->iDb];
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3VdbeAddOp3(v, OP_Le, memId+2, sqlite3VdbeCurrentAddr(v)+7, memId);
    VdbeCoverage(v);
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    aOp = sqlite3VdbeAddOpList(v, ArraySize(autoIncEnd), autoIncEnd, iLn);
    if( aOp==0 ) break;
    aOp[0].p1 = memId+1;
    aOp[1].p2 = memId+1;
    aOp[2].p1 = memId-1;
    aOp[2].p3 = iRec;
    aOp[3].p2 = iRec;
    aOp[3].p3 = memId+1;
    aOp[3].p5 = OPFLAG_APPEND;
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}